

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::initialiseLpColBound(HEkk *this)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  HighsInt iCol;
  long lVar10;
  
  iVar2 = (this->lp_).num_col_;
  pdVar3 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  pdVar9 = (this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 < iVar2; lVar10 = lVar10 + 1) {
    pdVar5[lVar10] = pdVar3[lVar10];
    dVar1 = pdVar4[lVar10];
    pdVar6[lVar10] = dVar1;
    pdVar7[lVar10] = dVar1 - pdVar5[lVar10];
    pdVar8[lVar10] = 0.0;
    pdVar9[lVar10] = 0.0;
  }
  return;
}

Assistant:

void HEkk::initialiseLpColBound() {
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    info_.workLower_[iCol] = lp_.col_lower_[iCol];
    info_.workUpper_[iCol] = lp_.col_upper_[iCol];
    info_.workRange_[iCol] = info_.workUpper_[iCol] - info_.workLower_[iCol];
    info_.workLowerShift_[iCol] = 0;
    info_.workUpperShift_[iCol] = 0;
  }
}